

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_variable_declaration
                    (gravity_parser_t *parser,_Bool isstatement,gtoken_t access_specifier,
                    gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer;
  gravity_delegate_t *pgVar1;
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  _Bool _Var2;
  gtoken_t gVar3;
  int iVar4;
  gnode_variable_decl_t *vdecl;
  gnode_r *pgVar5;
  char *pcVar6;
  char *annotation_type;
  uint16_t *__ptr;
  gnode_t *pgVar7;
  char *__s1;
  gnode_r *pgVar8;
  char *pcVar9;
  gnode_t *pgVar10;
  gnode_t **ppgVar11;
  size_t sVar12;
  gnode_t *pgVar13;
  size_t sVar14;
  undefined1 uVar15;
  size_t sVar16;
  gnode_t *pgVar17;
  bool bVar18;
  gtoken_s token_block;
  gtoken_s token2;
  gtoken_s token_1;
  gtoken_s token;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gVar3 = gravity_lexer_next(lexer);
  _Var2 = token_isvariable_declaration(gVar3);
  if (_Var2) {
    gravity_lexer_token(lexer);
    sVar14 = parser->declarations->n;
    if (sVar14 == 0) {
      pgVar7 = (gnode_t *)0x0;
    }
    else {
      pgVar7 = parser->declarations->p[sVar14 - 1];
    }
    token_00.colno = token_block.colno;
    token_00._0_8_ = token_block._0_8_;
    token_00.position = token_block.position;
    token_00.bytes = token_block.bytes;
    token_00.length = token_block.length;
    token_00.fileid = token_block.fileid;
    token_00.builtin = token_block.builtin;
    token_00.value = token_block.value;
    vdecl = (gnode_variable_decl_t *)
            gnode_variable_decl_create
                      (token_00,gVar3,access_specifier,storage_specifier,(gnode_r *)0x0,pgVar7);
    pgVar5 = gnode_array_create();
    while (pcVar6 = parse_identifier(parser), pcVar6 != (char *)0x0) {
      gravity_lexer_token(lexer);
      token2.value = token_block.value;
      token2.position = token_block.position;
      token2.colno = token_block.colno;
      token2._16_8_ = token_block._16_8_;
      token2._24_8_ = token_block._24_8_;
      token2._0_8_ = token_block._0_8_;
      annotation_type = parse_optional_type_annotation(parser);
      if (((annotation_type != (char *)0x0) &&
          (pgVar1 = parser->delegate, pgVar1 != (gravity_delegate_t *)0x0)) &&
         (pgVar1->type_callback != (gravity_type_callback)0x0)) {
        (*pgVar1->type_callback)(&token2,annotation_type,pgVar1->xdata);
      }
      gVar3 = gravity_lexer_peek(lexer);
      _Var2 = token_isvariable_assignment(gVar3);
      if (_Var2) {
        gravity_lexer_next(lexer);
        sVar14 = (parser->vdecl).n;
        __ptr = (parser->vdecl).p;
        if (sVar14 == (parser->vdecl).m) {
          sVar12 = sVar14 * 2;
          if (sVar14 == 0) {
            sVar12 = 8;
          }
          (parser->vdecl).m = sVar12;
          __ptr = (uint16_t *)realloc(__ptr,sVar12 * 2);
          (parser->vdecl).p = __ptr;
          sVar14 = (parser->vdecl).n;
        }
        (parser->vdecl).n = sVar14 + 1;
        __ptr[sVar14] = 1;
        pgVar7 = parse_expression(parser);
        (parser->vdecl).n = (parser->vdecl).n - 1;
LAB_0011b7fc:
        uVar15 = 0;
      }
      else {
        if (gVar3 != TOK_OP_OPEN_CURLYBRACE) {
          pgVar7 = (gnode_t *)0x0;
          goto LAB_0011b7fc;
        }
        gravity_lexer_next(lexer);
        lexer_00 = parser->lexer->p[parser->lexer->n - 1];
        gravity_lexer_token(lexer_00);
        pgVar7 = (gnode_t *)0x0;
        pgVar13 = (gnode_t *)0x0;
        while (pgVar17 = pgVar7, gVar3 = gravity_lexer_peek(lexer_00),
              gVar3 != TOK_OP_CLOSED_CURLYBRACE) {
          __s1 = parse_identifier(parser);
          if (__s1 == (char *)0x0) {
            pgVar7 = (gnode_t *)0x0;
            goto LAB_0011b924;
          }
          gravity_lexer_token(lexer_00);
          iVar4 = strcmp(__s1,"get");
          bVar18 = iVar4 == 0;
          if (bVar18) {
            pgVar8 = gnode_array_create();
            sVar14 = pgVar8->n;
            if (sVar14 == pgVar8->m) {
              sVar12 = sVar14 * 2;
              if (sVar14 == 0) {
                sVar12 = 8;
              }
              pgVar8->m = sVar12;
              ppgVar11 = (gnode_t **)realloc(pgVar8->p,sVar12 << 3);
              pgVar8->p = ppgVar11;
            }
            pcVar9 = string_dup("self");
            sVar14 = parser->declarations->n;
            if (sVar14 == 0) {
              pgVar7 = (gnode_t *)0x0;
            }
            else {
              pgVar7 = parser->declarations->p[sVar14 - 1];
            }
            pgVar7 = gnode_variable_create
                               ((gtoken_s)ZEXT840(0),pcVar9,(char *)0x0,(gnode_t *)0x0,pgVar7,
                                (gnode_variable_decl_t *)0x0);
            sVar14 = pgVar8->n;
            pgVar8->n = sVar14 + 1;
            pgVar8->p[sVar14] = pgVar7;
          }
          else {
            pgVar8 = (gnode_r *)0x0;
          }
          iVar4 = strcmp(__s1,"set");
          if (iVar4 == 0) {
            gVar3 = gravity_lexer_peek(lexer_00);
            if (gVar3 == TOK_OP_OPEN_PARENTHESIS) {
              parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
              bVar18 = false;
              pgVar8 = parse_optional_parameter_declaration(parser,false,(_Bool *)0x0);
              parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
            }
            else {
              pgVar8 = gnode_array_create();
              sVar14 = pgVar8->n;
              if (sVar14 == pgVar8->m) {
                sVar12 = sVar14 * 2;
                if (sVar14 == 0) {
                  sVar12 = 8;
                }
                pgVar8->m = sVar12;
                ppgVar11 = (gnode_t **)realloc(pgVar8->p,sVar12 << 3);
                pgVar8->p = ppgVar11;
              }
              pcVar9 = string_dup("self");
              sVar14 = parser->declarations->n;
              if (sVar14 == 0) {
                pgVar7 = (gnode_t *)0x0;
              }
              else {
                pgVar7 = parser->declarations->p[sVar14 - 1];
              }
              pgVar7 = gnode_variable_create
                                 ((gtoken_s)ZEXT840(0),pcVar9,(char *)0x0,(gnode_t *)0x0,pgVar7,
                                  (gnode_variable_decl_t *)0x0);
              sVar12 = pgVar8->n;
              sVar14 = sVar12 + 1;
              pgVar8->n = sVar14;
              pgVar8->p[sVar12] = pgVar7;
              if (sVar14 == pgVar8->m) {
                sVar12 = sVar14 * 2;
                if (sVar14 == 0) {
                  sVar12 = 8;
                }
                pgVar8->m = sVar12;
                ppgVar11 = (gnode_t **)realloc(pgVar8->p,sVar12 << 3);
                pgVar8->p = ppgVar11;
              }
              pcVar9 = string_dup("value");
              sVar14 = parser->declarations->n;
              if (sVar14 == 0) {
                pgVar7 = (gnode_t *)0x0;
              }
              else {
                pgVar7 = parser->declarations->p[sVar14 - 1];
              }
              bVar18 = false;
              pgVar7 = gnode_variable_create
                                 ((gtoken_s)ZEXT840(0),pcVar9,(char *)0x0,(gnode_t *)0x0,pgVar7,
                                  (gnode_variable_decl_t *)0x0);
              sVar14 = pgVar8->n;
              pgVar8->n = sVar14 + 1;
              pgVar8->p[sVar14] = pgVar7;
            }
          }
          free(__s1);
          sVar14 = parser->declarations->n;
          if (sVar14 == 0) {
            pgVar7 = (gnode_t *)0x0;
          }
          else {
            pgVar7 = parser->declarations->p[sVar14 - 1];
          }
          token_01.colno = token_1.colno;
          token_01._0_8_ = token_1._0_8_;
          token_01.position = token_1.position;
          token_01.bytes = token_1.bytes;
          token_01.length = token_1.length;
          token_01.fileid = token_1.fileid;
          token_01.builtin = token_1.builtin;
          token_01.value = token_1.value;
          pgVar10 = gnode_function_decl_create
                              (token_01,(char *)0x0,TOK_EOF,TOK_EOF,pgVar8,
                               (gnode_compound_stmt_t *)0x0,pgVar7);
          *(undefined4 *)&pgVar10[1].field_0xc = 0x22;
          pgVar8 = parser->declarations;
          sVar14 = pgVar8->n;
          if (sVar14 == pgVar8->m) {
            sVar12 = sVar14 * 2;
            if (sVar14 == 0) {
              sVar12 = 8;
            }
            pgVar8->m = sVar12;
            ppgVar11 = (gnode_t **)realloc(pgVar8->p,sVar12 << 3);
            pgVar8 = parser->declarations;
            pgVar8->p = ppgVar11;
            sVar14 = pgVar8->n;
          }
          else {
            ppgVar11 = pgVar8->p;
          }
          pgVar8->n = sVar14 + 1;
          ppgVar11[sVar14] = pgVar10;
          pgVar7 = parse_compound_statement(parser);
          parser->declarations->n = parser->declarations->n - 1;
          *(gnode_t **)&pgVar10[1].token.fileid = pgVar7;
          pgVar7 = pgVar10;
          if (bVar18) {
            pgVar7 = pgVar17;
            pgVar13 = pgVar10;
          }
        }
        pgVar8 = gnode_array_create();
        sVar14 = pgVar8->n;
        sVar12 = pgVar8->m;
        if (sVar14 == sVar12) {
          sVar12 = sVar14 * 2;
          if (sVar14 == 0) {
            sVar12 = 8;
          }
          pgVar8->m = sVar12;
          ppgVar11 = (gnode_t **)realloc(pgVar8->p,sVar12 << 3);
          pgVar8->p = ppgVar11;
          sVar14 = pgVar8->n;
          sVar12 = pgVar8->m;
        }
        else {
          ppgVar11 = pgVar8->p;
        }
        sVar16 = sVar14 + 1;
        pgVar8->n = sVar16;
        ppgVar11[sVar14] = pgVar13;
        ppgVar11 = pgVar8->p;
        if (sVar16 == sVar12) {
          sVar14 = sVar12 * 2;
          if (sVar12 == 0) {
            sVar14 = 8;
          }
          pgVar8->m = sVar14;
          ppgVar11 = (gnode_t **)realloc(ppgVar11,sVar14 << 3);
          pgVar8->p = ppgVar11;
          sVar16 = pgVar8->n;
        }
        pgVar8->n = sVar16 + 1;
        ppgVar11[sVar16] = pgVar17;
        gravity_lexer_token(lexer_00);
        sVar14 = parser->declarations->n;
        if (sVar14 == 0) {
          pgVar7 = (gnode_t *)0x0;
        }
        else {
          pgVar7 = parser->declarations->p[sVar14 - 1];
        }
        token_02.colno = token_block.colno;
        token_02._0_8_ = token_block._0_8_;
        token_02.position = token_block.position;
        token_02.bytes = token_block.bytes;
        token_02.length = token_block.length;
        token_02.fileid = token_block.fileid;
        token_02.builtin = token_block.builtin;
        token_02.value = token_block.value;
        pgVar7 = gnode_block_stat_create
                           (NODE_COMPOUND_STAT,token_02,pgVar8,pgVar7,
                            (token_1.length + token_1.position) - token_block.position);
LAB_0011b924:
        parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
        uVar15 = 1;
      }
      sVar14 = parser->declarations->n;
      if (sVar14 == 0) {
        pgVar13 = (gnode_t *)0x0;
      }
      else {
        pgVar13 = parser->declarations->p[sVar14 - 1];
      }
      token_03.colno = token2.colno;
      token_03.type = token2.type;
      token_03.lineno = token2.lineno;
      token_03.position = token2.position;
      token_03.bytes = token2.bytes;
      token_03.length = token2.length;
      token_03.fileid = token2.fileid;
      token_03.builtin = token2.builtin;
      token_03.value = token2.value;
      pgVar7 = gnode_variable_create(token_03,pcVar6,annotation_type,pgVar7,pgVar13,vdecl);
      if (pgVar7 != (gnode_t *)0x0) {
        *(undefined1 *)((long)&pgVar7[1].token.length + 3) = uVar15;
        sVar14 = pgVar5->n;
        ppgVar11 = pgVar5->p;
        if (sVar14 == pgVar5->m) {
          sVar12 = sVar14 * 2;
          if (sVar14 == 0) {
            sVar12 = 8;
          }
          pgVar5->m = sVar12;
          ppgVar11 = (gnode_t **)realloc(ppgVar11,sVar12 << 3);
          pgVar5->p = ppgVar11;
          sVar14 = pgVar5->n;
        }
        pgVar5->n = sVar14 + 1;
        ppgVar11[sVar14] = pgVar7;
      }
      gVar3 = gravity_lexer_peek(lexer);
      if (gVar3 != TOK_OP_COMMA) {
        if (isstatement) {
          parse_semicolon(parser);
        }
        vdecl->decls = pgVar5;
        return &vdecl->base;
      }
      gravity_lexer_next(lexer);
    }
  }
  else {
    gravity_lexer_token(lexer);
    pcVar6 = token_name(gVar3);
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x1405c4,pcVar6);
  }
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_variable_declaration (gravity_parser_t *parser, bool isstatement, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DEBUG_PARSER("parse_variable_declaration");
    DECLARE_LEXER;

    gnode_r *decls = NULL;
    gnode_t *decl = NULL;
    gnode_t *expr = NULL;
    const char *identifier = NULL;
    const char *type_annotation = NULL;
    gtoken_t type;
    gtoken_t peek;
    gtoken_s token, token2;

    // access_specifier? storage_specifier? variable_declaration ';'
    // variable_declaration: variable_declarator decl_item
    // variable_declarator: 'const' | 'var'
    // decl_item: (IDENTIFIER assignment?) (',' IDENTIFIER assignment?)*
    // assignment

    // sanity check on variable type
    type = gravity_lexer_next(lexer);
    if (!token_isvariable_declaration(type)) {
        REPORT_ERROR(gravity_lexer_token(lexer), "VAR or CONST expected here but found %s.", token_name(type));
        return NULL;
    }
    token = gravity_lexer_token(lexer);

    // create node variable declaration
    gnode_variable_decl_t *node = (gnode_variable_decl_t *) gnode_variable_decl_create(token, type, access_specifier, storage_specifier, NULL, LAST_DECLARATION());

    // initialize node array
    decls = gnode_array_create();

loop:
    identifier = parse_identifier(parser);
    if (!identifier) return NULL;
    token2 = gravity_lexer_token(lexer);

    // type annotation is optional so it can be NULL
    type_annotation = parse_optional_type_annotation(parser);
    DEBUG_PARSER("IDENTIFIER: %s %s", identifier, (type_annotation) ? type_annotation : "");
    if (type_annotation && parser->delegate && parser->delegate->type_callback) {
        parser->delegate->type_callback(&token2, type_annotation, parser->delegate->xdata);
    }

    // check for optional assignment or getter/setter declaration (ONLY = is ALLOWED here!)
    expr = NULL;
    bool is_computed = false;
    peek = gravity_lexer_peek(lexer);
    if (token_isvariable_assignment(peek)) {
        gravity_lexer_next(lexer); // consume ASSIGNMENT
        marray_push(uint16_t, parser->vdecl, 1);
        expr = parse_expression(parser);
        marray_pop(parser->vdecl);
    } else if (peek == TOK_OP_OPEN_CURLYBRACE) {
        gravity_lexer_next(lexer); // consume TOK_OP_OPEN_CURLYBRACE
        expr = parse_getter_setter(parser);
        parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);
        is_computed = true;
    }

    // sanity checks
    // 1. CONST must be followed by an assignment expression ?
    // 2. check if identifier is unique inside variable declarations

    decl = gnode_variable_create(token2, identifier, type_annotation, expr, LAST_DECLARATION(), node);
    if (decl) {
        ((gnode_var_t *)decl)->iscomputed = is_computed;
        gnode_array_push(decls, decl);
    }

    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_COMMA) {
        gravity_lexer_next(lexer); // consume TOK_OP_COMMA
        goto loop;
    }

    // check and consume TOK_OP_SEMICOLON (ALWAYS required for assignments)
    // Aaron: I would keep it consistent, even if it's not strictly required.
    // Otherwise we end up with all of JavaScript's terrible ideas. ;-)
    // So I would require the semicolon at the end of any assignment statement.
    if (isstatement) parse_semicolon(parser);

    // finish to setup declaration
    node->decls = decls;

    return (gnode_t *)node;
}